

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_cf_dofile(lua_State *L)

{
  int iVar1;
  GCstr *pGVar2;
  TValue *pTVar3;
  GCstr *filename;
  
  pTVar3 = L->top;
  if ((L->base < pTVar3) && ((L->base->field_2).it != 0xffffffff)) {
    pGVar2 = lj_lib_checkstr(L,1);
    pTVar3 = L->top;
  }
  else {
    pGVar2 = (GCstr *)0x0;
  }
  (pTVar3->field_2).it = 0xffffffff;
  L->top = L->base + 1;
  filename = pGVar2 + 1;
  if (pGVar2 == (GCstr *)0x0) {
    filename = (GCstr *)0x0;
  }
  iVar1 = luaL_loadfilex(L,(char *)filename,(char *)0x0);
  if (iVar1 == 0) {
    lj_vm_call(L,L->top,0);
    return (int)((ulong)((long)L->top - (long)L->base) >> 3) + -1;
  }
  lj_err_run(L);
}

Assistant:

LJLIB_CF(dofile)
{
  GCstr *fname = lj_lib_optstr(L, 1);
  setnilV(L->top);
  L->top = L->base+1;
  if (luaL_loadfile(L, fname ? strdata(fname) : NULL) != 0)
    lua_error(L);
  lua_call(L, 0, LUA_MULTRET);
  return (int)(L->top - L->base) - 1;
}